

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

string * __thiscall
ObjectFile::getFilename_abi_cxx11_(string *__return_storage_ptr__,ObjectFile *this)

{
  string *psVar1;
  long lVar2;
  ulong uVar3;
  
  psVar1 = &this->path;
  lVar2 = std::__cxx11::string::find_last_of((char *)psVar1,0x1332e9);
  if ((lVar2 != -1) &&
     (uVar3 = std::__cxx11::string::find_last_of((char *)psVar1,0x1332e9),
     uVar3 < (this->path)._M_string_length)) {
    std::__cxx11::string::find_last_of((char *)psVar1,0x1332e9);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectFile::getFilename() const
{
	if ((path.find_last_of(OS_PATHSEP) != std::string::npos) &&
	    (path.find_last_of(OS_PATHSEP) < path.size()))
	{
		return path.substr(path.find_last_of(OS_PATHSEP) + 1);
	}
	else
	{
		return path;
	}
}